

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O2

int stbi__decode_jpeg_header(stbi__jpeg *z,int scan)

{
  uint uVar1;
  uint uVar2;
  stbi__context *s;
  char *pcVar3;
  stbi_uc sVar4;
  byte bVar5;
  int iVar6;
  uint uVar7;
  stbi__uint32 sVar8;
  uint uVar9;
  void *pvVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  int iVar16;
  int iVar17;
  ulong uVar18;
  int iVar19;
  stbi__int16 *psVar20;
  int *local_68;
  
  z->marker = 0xff;
  sVar4 = stbi__get_marker(z);
  if (sVar4 == 0xd8) {
    if (scan == 1) {
      return 1;
    }
    bVar5 = stbi__get_marker(z);
    while ((bVar5 != 0xc2 && ((bVar5 & 0xfe) != 0xc0))) {
      iVar6 = stbi__process_marker(z,(uint)bVar5);
      if (iVar6 == 0) {
        return 0;
      }
      while (bVar5 = stbi__get_marker(z), bVar5 == 0xff) {
        iVar6 = stbi__at_eof(z->s);
        if (iVar6 != 0) {
          stbi__g_failure_reason = "no SOF";
          return 0;
        }
      }
    }
    z->progressive = (uint)(bVar5 == 0xc2);
    s = z->s;
    uVar7 = stbi__get16be(s);
    pcVar3 = "bad SOF len";
    if (10 < uVar7) {
      sVar4 = stbi__get8(s);
      if (sVar4 == '\b') {
        sVar8 = stbi__get16be(s);
        s->img_y = sVar8;
        if (sVar8 == 0) {
          pcVar3 = "no header height";
        }
        else {
          sVar8 = stbi__get16be(s);
          s->img_x = sVar8;
          if (sVar8 == 0) {
            pcVar3 = "0 width";
          }
          else {
            bVar5 = stbi__get8(s);
            if ((bVar5 & 0xfd) == 1) {
              s->img_n = (uint)bVar5;
              for (lVar13 = 0; (ulong)(uint)bVar5 * 0x60 - lVar13 != 0; lVar13 = lVar13 + 0x60) {
                *(undefined8 *)((long)&z->img_comp[0].data + lVar13) = 0;
                *(undefined8 *)((long)&z->img_comp[0].linebuf + lVar13) = 0;
              }
              if (uVar7 == (uint)bVar5 + (uint)bVar5 * 2 + 8) {
                z->rgb = 0;
                local_68 = &z->img_comp[0].tq;
                uVar11 = 0;
                do {
                  uVar7 = s->img_n;
                  if ((long)(int)uVar7 <= (long)uVar11) {
                    if (scan != 0) {
                      return 1;
                    }
                    uVar1 = s->img_x;
                    uVar2 = s->img_y;
                    uVar11 = 0;
                    if ((uint)((0x40000000 / (ulong)uVar1) / (ulong)uVar7) < uVar2) {
                      stbi__g_failure_reason = "too large";
                      return 0;
                    }
                    uVar14 = (ulong)uVar7;
                    if ((int)uVar7 < 1) {
                      uVar14 = uVar11;
                    }
                    uVar15 = 1;
                    uVar18 = 1;
                    while( true ) {
                      iVar6 = (int)uVar15;
                      iVar17 = (int)uVar18;
                      if (uVar14 * 0x60 - uVar11 == 0) break;
                      uVar7 = *(uint *)((long)&z->img_comp[0].h + uVar11);
                      uVar9 = *(uint *)((long)&z->img_comp[0].v + uVar11);
                      if (iVar6 < (int)uVar7) {
                        uVar15 = (ulong)uVar7;
                      }
                      if (iVar17 < (int)uVar9) {
                        uVar18 = (ulong)uVar9;
                      }
                      uVar11 = uVar11 + 0x60;
                    }
                    z->img_h_max = iVar6;
                    z->img_v_max = iVar17;
                    z->img_mcu_w = iVar6 * 8;
                    z->img_mcu_h = iVar17 * 8;
                    uVar11 = 0;
                    uVar7 = ((uVar1 + iVar6 * 8) - 1) / (uint)(iVar6 * 8);
                    z->img_mcu_x = uVar7;
                    uVar9 = ((uVar2 + iVar17 * 8) - 1) / (uint)(iVar17 * 8);
                    z->img_mcu_y = uVar9;
                    psVar20 = z->fast_ac[3] + 0x1f8;
                    while( true ) {
                      if (uVar14 == uVar11) {
                        return 1;
                      }
                      *(int *)(psVar20 + 0x22) =
                           (int)((*(int *)(psVar20 + 0x16) * uVar1 + iVar6 + -1) / uVar15);
                      *(int *)(psVar20 + 0x24) =
                           (int)((*(int *)(psVar20 + 0x18) * uVar2 + iVar17 + -1) / uVar18);
                      iVar16 = *(int *)(psVar20 + 0x16) * uVar7;
                      *(int *)(psVar20 + 0x26) = iVar16 * 8;
                      iVar19 = *(int *)(psVar20 + 0x18) * uVar9;
                      *(int *)(psVar20 + 0x28) = iVar19 * 8;
                      pvVar10 = malloc((long)(int)(iVar19 * 8 * iVar16 * 8 | 0xf));
                      *(void **)(psVar20 + 0x30) = pvVar10;
                      if (pvVar10 == (void *)0x0) break;
                      *(ulong *)(psVar20 + 0x2c) = (long)pvVar10 + 0xfU & 0xfffffffffffffff0;
                      *(undefined8 *)(psVar20 + 0x38) = 0;
                      if (z->progressive == 0) {
                        uVar12 = 0;
                        pvVar10 = (void *)0x0;
                      }
                      else {
                        *(int *)(psVar20 + 0x40) = iVar16;
                        *(int *)(psVar20 + 0x42) = iVar19;
                        pvVar10 = malloc((long)(iVar16 * iVar19 * 0x40) * 2 + 0xf);
                        uVar12 = (long)pvVar10 + 0xfU & 0xfffffffffffffff0;
                      }
                      *(ulong *)(psVar20 + 0x3c) = uVar12;
                      *(void **)(psVar20 + 0x34) = pvVar10;
                      uVar11 = uVar11 + 1;
                      psVar20 = psVar20 + 0x30;
                    }
                    for (; 0 < (long)uVar11; uVar11 = uVar11 - 1) {
                      free(*(void **)psVar20);
                      psVar20[0] = 0;
                      psVar20[1] = 0;
                      psVar20[2] = 0;
                      psVar20[3] = 0;
                      psVar20 = psVar20 + -0x30;
                    }
                    stbi__g_failure_reason = "outofmem";
                    return 0;
                  }
                  bVar5 = stbi__get8(s);
                  ((anon_struct_96_18_0d0905d3 *)(local_68 + -3))->id = (uint)bVar5;
                  if (uVar11 != bVar5 && uVar11 + 1 != (ulong)bVar5) {
                    if (bVar5 != (&stbi__process_frame_header(stbi__jpeg*,int)::rgb)[uVar11]) {
                      stbi__g_failure_reason = "bad component ID";
                      return 0;
                    }
                    z->rgb = z->rgb + 1;
                  }
                  bVar5 = stbi__get8(s);
                  local_68[-2] = (uint)(bVar5 >> 4);
                  if ((byte)(bVar5 + 0xb0) < 0xc0) {
                    stbi__g_failure_reason = "bad H";
                    return 0;
                  }
                  local_68[-1] = bVar5 & 0xf;
                  if ((bVar5 & 0xf) - 5 < 0xfffffffc) {
                    stbi__g_failure_reason = "bad V";
                    return 0;
                  }
                  bVar5 = stbi__get8(s);
                  *local_68 = (uint)bVar5;
                  local_68 = local_68 + 0x18;
                  uVar11 = uVar11 + 1;
                } while (bVar5 < 4);
                pcVar3 = "bad TQ";
              }
            }
            else {
              pcVar3 = "bad component count";
            }
          }
        }
      }
      else {
        pcVar3 = "only 8-bit";
      }
    }
  }
  else {
    pcVar3 = "no SOI";
  }
  stbi__g_failure_reason = pcVar3;
  return 0;
}

Assistant:

static int stbi__decode_jpeg_header(stbi__jpeg *z, int scan)
{
   int m;
   z->marker = STBI__MARKER_none; // initialize cached marker to empty
   m = stbi__get_marker(z);
   if (!stbi__SOI(m)) return stbi__err("no SOI","Corrupt JPEG");
   if (scan == STBI__SCAN_type) return 1;
   m = stbi__get_marker(z);
   while (!stbi__SOF(m)) {
      if (!stbi__process_marker(z,m)) return 0;
      m = stbi__get_marker(z);
      while (m == STBI__MARKER_none) {
         // some files have extra padding after their blocks, so ok, we'll scan
         if (stbi__at_eof(z->s)) return stbi__err("no SOF", "Corrupt JPEG");
         m = stbi__get_marker(z);
      }
   }
   z->progressive = stbi__SOF_progressive(m);
   if (!stbi__process_frame_header(z, scan)) return 0;
   return 1;
}